

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReplacementVisitor.cpp
# Opt level: O2

void __thiscall OpenMD::ReplacementVisitor::visit(ReplacementVisitor *this,DirectionalAtom *datom)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  element_type *peVar3;
  ReplacementVisitor *this_00;
  DirectionalAtom *atom;
  bool bVar4;
  ostream *poVar5;
  Vector<double,_3U> *v;
  undefined8 unaff_R13;
  undefined1 auVar6 [16];
  shared_ptr<OpenMD::AtomData> atomData;
  shared_ptr<OpenMD::AtomInfo> atomInfo;
  shared_ptr<OpenMD::AtomInfo> siteInfo;
  Mat3x3d mat;
  shared_ptr<OpenMD::GenericData> data;
  iterator iter;
  Vector3d j;
  Vector3d vel;
  Vector3d pos;
  Mat3x3d I;
  RotMat3x3d Atrans;
  Vector3d newVec;
  Vector3d trq;
  Vector3d frc;
  RotMat3x3d A;
  Mat3x3d skewMat;
  __shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2> local_318;
  __shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2> local_308;
  __shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2> local_2f8;
  undefined4 local_2dc;
  RectMatrix<double,_3U,_3U> local_2d8;
  ReplacementVisitor *local_290;
  __shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2> local_288;
  DirectionalAtom *local_270;
  undefined8 local_268;
  undefined1 local_260 [72];
  __shared_ptr<OpenMD::GenericData,(__gnu_cxx::_Lock_policy)2> local_218 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_210;
  __shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2> local_208;
  undefined1 local_1f8 [16];
  double local_1e8;
  Vector<double,_3U> local_1e0;
  Vector<double,_3U> local_1c8;
  Vector<double,_3U> local_1b0;
  RectMatrix<double,_3U,_3U> local_198;
  RectMatrix<double,_3U,_3U> local_150;
  Vector<double,_3U> local_108;
  Vector<double,_3U> local_f0;
  Vector<double,_3U> local_d8;
  RectMatrix<double,_3U,_3U> local_c0;
  undefined1 local_78 [24];
  double local_60;
  double local_58;
  undefined1 local_50 [16];
  double local_40;
  double local_38;
  
  SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)&local_c0);
  SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)&local_150);
  SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)&local_198);
  Vector<double,_3U>::Vector(&local_1b0);
  Vector<double,_3U>::Vector(&local_1c8);
  Vector<double,_3U>::Vector(&local_d8);
  Vector<double,_3U>::Vector(&local_f0);
  Vector<double,_3U>::Vector((Vector<double,_3U> *)local_1f8);
  SquareMatrix<double,_3>::SquareMatrix((SquareMatrix<double,_3> *)local_78);
  Vector<double,_3U>::Vector(&local_108);
  local_308._M_ptr = (element_type *)0x0;
  local_308._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_318._M_ptr = (element_type *)0x0;
  local_318._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_288._M_ptr = (element_type *)0x0;
  local_288._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (*(datom->super_Atom).super_StuntDouble._vptr_StuntDouble[7])(&local_2d8,datom);
  bVar4 = isReplacedAtom(this,(string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  if (!bVar4) goto LAB_001e71af;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d8,"ATOMDATA",(allocator<char> *)&local_1e0);
  StuntDouble::getPropertyByName((StuntDouble *)local_260,(string *)datom);
  std::__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_288,(__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2> *)local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_260 + 8));
  std::__cxx11::string::~string((string *)&local_2d8);
  if (local_288._M_ptr == (element_type *)0x0) {
    std::make_shared<OpenMD::AtomData>();
LAB_001e6da3:
    std::__shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_318,(__shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2> *)&local_2d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8.data_[0] + 1));
    local_2dc = 0;
  }
  else {
    std::dynamic_pointer_cast<OpenMD::AtomData,OpenMD::GenericData>
              ((shared_ptr<OpenMD::GenericData> *)&local_2d8);
    std::__shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_318,(__shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2> *)&local_2d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_2d8.data_[0] + 1));
    local_2dc = (undefined4)CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
    if (local_318._M_ptr == (element_type *)0x0) {
      poVar5 = std::operator<<((ostream *)&std::cerr,"can not get Atom Data from ");
      (*(datom->super_Atom).super_StuntDouble._vptr_StuntDouble[7])(&local_2d8,datom);
      poVar5 = std::operator<<(poVar5,(string *)&local_2d8);
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::make_shared<OpenMD::AtomData>();
      goto LAB_001e6da3;
    }
  }
  StuntDouble::getPos((Vector3d *)&local_2d8,(StuntDouble *)datom);
  Vector<double,_3U>::operator=(&local_1b0,(Vector<double,_3U> *)&local_2d8);
  StuntDouble::getVel((Vector3d *)&local_2d8,(StuntDouble *)datom);
  Vector<double,_3U>::operator=(&local_1c8,(Vector<double,_3U> *)&local_2d8);
  StuntDouble::getJ((Vector3d *)&local_2d8,(StuntDouble *)datom);
  Vector<double,_3U>::operator=((Vector<double,_3U> *)local_1f8,(Vector<double,_3U> *)&local_2d8);
  (*(datom->super_Atom).super_StuntDouble._vptr_StuntDouble[5])(&local_2d8,datom);
  RectMatrix<double,_3U,_3U>::operator=(&local_198,&local_2d8);
  StuntDouble::getA((RotMat3x3d *)&local_2d8,(StuntDouble *)datom);
  RectMatrix<double,_3U,_3U>::operator=(&local_c0,&local_2d8);
  local_78._0_8_ = 0.0;
  local_60 = -local_1e8 / local_198.data_[2][2];
  local_58 = 0.0;
  auVar6._8_8_ = local_1f8._8_8_ ^ 0x8000000000000000;
  auVar6._0_8_ = local_1e8;
  auVar1._8_8_ = local_198.data_[1][1];
  auVar1._0_8_ = local_198.data_[2][2];
  local_78._8_16_ = divpd(auVar6,auVar1);
  local_40 = -local_1f8._0_8_ / local_198.data_[0][0];
  auVar2._8_8_ = local_198.data_[1][1];
  auVar2._0_8_ = local_198.data_[0][0];
  local_50 = divpd(local_1f8,auVar2);
  local_38 = 0.0;
  operator*((SquareMatrix3<double> *)local_260,(SquareMatrix3<double> *)&local_c0,
            (SquareMatrix3<double> *)local_78);
  SquareMatrix3<double>::transpose
            ((SquareMatrix3<double> *)&local_2d8,(SquareMatrix3<double> *)local_260);
  local_270 = datom;
  SquareMatrix3<double>::transpose
            ((SquareMatrix3<double> *)local_260,(SquareMatrix3<double> *)&local_c0);
  RectMatrix<double,_3U,_3U>::operator=(&local_150,(RectMatrix<double,_3U,_3U> *)local_260);
  local_2f8._M_ptr = (element_type *)0x0;
  local_2f8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_268 = 0;
  local_290 = this;
  AtomData::beginAtomInfo
            ((AtomData *)local_260,
             (iterator *)
             (this->sites_).super___shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
  ;
  std::__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&local_2f8,(__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2> *)local_260);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_260 + 8));
  while (atom = local_270, this_00 = local_290, peVar3 = local_318._M_ptr,
        local_2f8._M_ptr != (element_type *)0x0) {
    operator*((Vector<double,_3U> *)local_260,&local_150,
              &((local_2f8._M_ptr)->pos).super_Vector<double,_3U>);
    Vector3<double>::operator=((Vector3<double> *)&local_108,(Vector<double,_3U> *)local_260);
    std::make_shared<OpenMD::AtomInfo>();
    std::__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_308,(__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2> *)local_260);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_260 + 8));
    std::__cxx11::string::_M_assign((string *)local_308._M_ptr);
    operator+((Vector<double,_3U> *)local_260,&local_1b0,&local_108);
    Vector3<double>::operator=(&(local_308._M_ptr)->pos,(Vector<double,_3U> *)local_260);
    v = (Vector<double,_3U> *)OpenMD::V3Zero;
    if ((local_2f8._M_ptr)->hasVector == true) {
      operator*((Vector<double,_3U> *)local_260,&local_150,
                &((local_2f8._M_ptr)->vec).super_Vector<double,_3U>);
      Vector3<double>::operator=((Vector3<double> *)&local_108,(Vector<double,_3U> *)local_260);
      v = &local_108;
    }
    Vector<double,_3U>::operator=(&((local_308._M_ptr)->vec).super_Vector<double,_3U>,v);
    operator*(&local_1e0,&local_2d8,&((local_2f8._M_ptr)->pos).super_Vector<double,_3U>);
    operator+((Vector<double,_3U> *)local_260,&local_1c8,&local_1e0);
    Vector3<double>::operator=(&(local_308._M_ptr)->vel,(Vector<double,_3U> *)local_260);
    peVar3 = local_318._M_ptr;
    (local_308._M_ptr)->hasVelocity = true;
    std::__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_208,&local_308);
    std::
    vector<std::shared_ptr<OpenMD::AtomInfo>,_std::allocator<std::shared_ptr<OpenMD::AtomInfo>_>_>::
    push_back(&peVar3->data,(value_type *)&local_208);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_208._M_refcount);
    AtomData::nextAtomInfo
              ((AtomData *)local_260,
               (iterator *)
               (local_290->sites_).super___shared_ptr<OpenMD::AtomData,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    std::__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_2f8,(__shared_ptr<OpenMD::AtomInfo,_(__gnu_cxx::_Lock_policy)2> *)local_260);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_260 + 8));
  }
  if ((char)local_2dc == '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_260,"ATOMDATA",(allocator<char> *)&local_1e0);
    std::__cxx11::string::_M_assign((string *)&(peVar3->super_GenericData).id_);
    std::__cxx11::string::~string((string *)local_260);
    std::__shared_ptr<OpenMD::GenericData,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<OpenMD::AtomData,void>(local_218,&local_318);
    StuntDouble::addProperty((StuntDouble *)atom,(shared_ptr<OpenMD::GenericData> *)local_218);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_210);
  }
  BaseAtomVisitor::setVisited(&this_00->super_BaseAtomVisitor,&atom->super_Atom);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2f8._M_refcount);
LAB_001e71af:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_288._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_318._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_308._M_refcount);
  return;
}

Assistant:

void ReplacementVisitor::visit(DirectionalAtom* datom) {
    RotMat3x3d A;
    RotMat3x3d Atrans;
    Mat3x3d I;
    Vector3d pos;
    Vector3d vel;
    Vector3d frc;
    Vector3d trq;
    Vector3d j;
    Mat3x3d skewMat;

    Vector3d newVec;
    std::shared_ptr<AtomInfo> atomInfo;
    std::shared_ptr<AtomData> atomData;
    std::shared_ptr<GenericData> data;
    bool haveAtomData;

    // if atom is not one of our recognized atom types, just skip it
    if (!isReplacedAtom(datom->getType())) return;

    data = datom->getPropertyByName("ATOMDATA");

    if (data != nullptr) {
      atomData = std::dynamic_pointer_cast<AtomData>(data);

      if (atomData == nullptr) {
        std::cerr << "can not get Atom Data from " << datom->getType()
                  << std::endl;
        atomData     = std::make_shared<AtomData>();
        haveAtomData = false;
      } else
        haveAtomData = true;
    } else {
      atomData     = std::make_shared<AtomData>();
      haveAtomData = false;
    }

    pos = datom->getPos();
    vel = datom->getVel();

    j = datom->getJ();
    I = datom->getI();
    A = datom->getA();

    skewMat(0, 0) = 0;
    skewMat(0, 1) = j[2] / I(2, 2);
    skewMat(0, 2) = -j[1] / I(1, 1);
    skewMat(1, 0) = -j[2] / I(2, 2);
    skewMat(1, 1) = 0;
    skewMat(1, 2) = j[0] / I(0, 0);
    skewMat(2, 0) = j[1] / I(1, 1);
    skewMat(2, 1) = -j[0] / I(0, 0);
    skewMat(2, 2) = 0;
    Mat3x3d mat   = (A * skewMat).transpose();

    // We need A^T to convert from body-fixed to space-fixed:
    Atrans = A.transpose();

    std::shared_ptr<AtomInfo> siteInfo;
    std::vector<std::shared_ptr<AtomInfo>>::iterator iter;

    for (siteInfo = sites_->beginAtomInfo(iter); siteInfo;
         siteInfo = sites_->nextAtomInfo(iter)) {
      newVec = Atrans * siteInfo->pos;

      atomInfo               = std::make_shared<AtomInfo>();
      atomInfo->atomTypeName = siteInfo->atomTypeName;
      atomInfo->pos          = pos + newVec;

      if (siteInfo->hasVector) {
        newVec        = Atrans * siteInfo->vec;
        atomInfo->vec = newVec;
      } else {
        atomInfo->vec = V3Zero;
      }

      atomInfo->vel         = vel + mat * siteInfo->pos;
      atomInfo->hasVelocity = true;

      atomData->addAtomInfo(atomInfo);
    }
    if (!haveAtomData) {
      atomData->setID("ATOMDATA");
      datom->addProperty(atomData);
    }

    setVisited(datom);
  }